

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

size_t testing::internal::GetThreadCount(void)

{
  ostream *this;
  __pid_t _Var1;
  size_t sVar2;
  int iVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  ifstream file;
  size_type *local_70;
  string dummy;
  string filename;
  
  Message::Message((Message *)&local_278);
  this = (ostream *)(local_278.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(this,"/proc/",6);
  _Var1 = getpid();
  std::ostream::operator<<((ostream *)this,_Var1);
  std::__ostream_insert<char,std::char_traits<char>>(this,"/stat",5);
  StringStreamToString((string *)((long)&dummy.field_2 + 8),local_278.ptr_);
  if (local_278.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_278.ptr_ + 8))(local_278.ptr_);
  }
  dummy._M_dataplus._M_p = (pointer)0x0;
  dummy._M_string_length._0_1_ = 0;
  local_70 = &dummy._M_string_length;
  std::ifstream::ifstream(&local_278,(char *)dummy.field_2._8_8_,_S_in);
  iVar3 = -0x14;
  while (iVar3 = iVar3 + 1, iVar3 != 0) {
    std::operator>>((istream *)&local_278,(string *)&local_70);
  }
  filename.field_2._12_4_ = 0;
  std::istream::operator>>((istream *)&local_278,(int *)(filename.field_2._M_local_buf + 0xc));
  sVar2 = (size_t)(int)filename.field_2._12_4_;
  std::ifstream::~ifstream(&local_278);
  if (local_70 != &dummy._M_string_length) {
    operator_delete(local_70);
  }
  if ((size_type *)dummy.field_2._8_8_ != &filename._M_string_length) {
    operator_delete((void *)dummy.field_2._8_8_);
  }
  return sVar2;
}

Assistant:

size_t GetThreadCount() {
  const string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<int>(filename, 19);
}